

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O0

void ldisc_free(Ldisc *ldisc)

{
  Ldisc *ldisc_local;
  
  bufchain_clear(&ldisc->input_queue);
  if (ldisc->term != (Terminal *)0x0) {
    ldisc->term->ldisc = (Ldisc *)0x0;
  }
  if (ldisc->backend != (Backend *)0x0) {
    backend_provide_ldisc(ldisc->backend,(Ldisc *)0x0);
  }
  if (ldisc->buf != (char *)0x0) {
    safefree(ldisc->buf);
  }
  if ((ldisc->prompts != (prompts_t *)0x0) && (ldisc->prompts->ldisc_ptr_to_us == &ldisc->prompts))
  {
    ldisc->prompts->ldisc_ptr_to_us = (prompts_t **)0x0;
  }
  delete_callbacks_for_context(ldisc);
  safefree(ldisc);
  return;
}

Assistant:

void ldisc_free(Ldisc *ldisc)
{
    bufchain_clear(&ldisc->input_queue);
    if (ldisc->term)
        ldisc->term->ldisc = NULL;
    if (ldisc->backend)
        backend_provide_ldisc(ldisc->backend, NULL);
    if (ldisc->buf)
        sfree(ldisc->buf);
    if (ldisc->prompts && ldisc->prompts->ldisc_ptr_to_us == &ldisc->prompts)
        ldisc->prompts->ldisc_ptr_to_us = NULL;
    delete_callbacks_for_context(ldisc);
    sfree(ldisc);
}